

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::WriteSiCurrentLoopParams(AmpIO *this,uint index,SiCurrentLoopParams *params)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  uint uVar10;
  
  if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
    return false;
  }
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (6 < uVar2) {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      if ((((index < this->NumMotors) && (params->kp < 0x40000)) && (params->ki < 0x40000)) &&
         (((params->kd < 0x40000 && (params->iTermLimit < 0x400)) &&
          (params->dutyCycleLimit < 0x400)))) {
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        uVar10 = index * 0x10 + 0x10;
        iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(uVar10 | 0x9001));
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(uVar10 | 0x9002),(ulong)params->ki);
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar5 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(uVar10 | 0x9005),(ulong)params->kd);
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar6 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(uVar10 | 0x9006),(ulong)params->ff_resistive);
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar7 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(uVar10 | 0x9003),(ulong)params->iTermLimit);
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar8 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(uVar10 | 0x9004),(ulong)params->dutyCycleLimit);
        return (bool)((byte)iVar8 & (byte)iVar7 &
                     (byte)iVar6 & (byte)iVar5 & (byte)iVar4 & (byte)iVar3);
      }
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "AmpIO::WriteSiCurrentLoopParams not implemented for ");
      BoardIO::GetHardwareVersion((BoardIO *)this);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  return false;
}

Assistant:

bool AmpIO::WriteSiCurrentLoopParams(unsigned int index, const SiCurrentLoopParams& params) const
{
    if (!port) return false;
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() != dRA1_String) {
        std::cerr << "AmpIO::WriteSiCurrentLoopParams not implemented for " << GetHardwareVersion() << std::endl;
        return false;
    }
    if (index >= NumMotors) return false;
    if (params.kp >= 1 << 18) return false;
    if (params.ki >= 1 << 18) return false;
    if (params.kd >= 1 << 18) return false;
    if (params.iTermLimit > 1023) return false;
    if (params.dutyCycleLimit > 1023) return false;

    bool success = true;
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_KP, params.kp);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_KI, params.ki);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_KD, params.kd);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_FF_RESISTIVE, params.ff_resistive);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_CURRENT_I_TERM_LIMIT, params.iTermLimit);
    success &= port->WriteQuadlet(BoardId,
        ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 |
        OFF_DUTY_CYCLE_LIMIT, params.dutyCycleLimit);
    return success;
}